

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_1_5.cpp
# Opt level: O0

void __thiscall QOpenGLFunctions_1_5::~QOpenGLFunctions_1_5(QOpenGLFunctions_1_5 *this)

{
  undefined8 *in_RDI;
  QAbstractOpenGLFunctions *unaff_retaddr;
  
  *in_RDI = &PTR__QOpenGLFunctions_1_5_00214910;
  if (in_RDI[2] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b9abe);
  }
  if (in_RDI[3] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b9adc);
  }
  if (in_RDI[4] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b9afa);
  }
  if (in_RDI[5] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b9b18);
  }
  if (in_RDI[6] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b9b36);
  }
  if (in_RDI[7] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b9b54);
  }
  if (in_RDI[8] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b9b72);
  }
  if (in_RDI[9] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b9b90);
  }
  if (in_RDI[10] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b9bae);
  }
  if (in_RDI[0xb] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b9bcc);
  }
  if (in_RDI[0xc] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1b9bea);
  }
  QAbstractOpenGLFunctions::~QAbstractOpenGLFunctions(unaff_retaddr);
  return;
}

Assistant:

QOpenGLFunctions_1_5::~QOpenGLFunctions_1_5()
{
    if (d_1_0_Core) {
        d_1_0_Core->refs.deref();
        Q_ASSERT(d_1_0_Core->refs.loadRelaxed());
    }
    if (d_1_1_Core) {
        d_1_1_Core->refs.deref();
        Q_ASSERT(d_1_1_Core->refs.loadRelaxed());
    }
    if (d_1_2_Core) {
        d_1_2_Core->refs.deref();
        Q_ASSERT(d_1_2_Core->refs.loadRelaxed());
    }
    if (d_1_3_Core) {
        d_1_3_Core->refs.deref();
        Q_ASSERT(d_1_3_Core->refs.loadRelaxed());
    }
    if (d_1_4_Core) {
        d_1_4_Core->refs.deref();
        Q_ASSERT(d_1_4_Core->refs.loadRelaxed());
    }
    if (d_1_5_Core) {
        d_1_5_Core->refs.deref();
        Q_ASSERT(d_1_5_Core->refs.loadRelaxed());
    }
    if (d_1_0_Deprecated) {
        d_1_0_Deprecated->refs.deref();
        Q_ASSERT(d_1_0_Deprecated->refs.loadRelaxed());
    }
    if (d_1_1_Deprecated) {
        d_1_1_Deprecated->refs.deref();
        Q_ASSERT(d_1_1_Deprecated->refs.loadRelaxed());
    }
    if (d_1_2_Deprecated) {
        d_1_2_Deprecated->refs.deref();
        Q_ASSERT(d_1_2_Deprecated->refs.loadRelaxed());
    }
    if (d_1_3_Deprecated) {
        d_1_3_Deprecated->refs.deref();
        Q_ASSERT(d_1_3_Deprecated->refs.loadRelaxed());
    }
    if (d_1_4_Deprecated) {
        d_1_4_Deprecated->refs.deref();
        Q_ASSERT(d_1_4_Deprecated->refs.loadRelaxed());
    }
}